

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::getp_apply_all(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_val_t *funcptr;
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  ulong idx;
  vm_rcdesc rc;
  
  if (getp_apply_all(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar3 = __cxa_guard_acquire(&getp_apply_all(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar3 != 0) {
      getp_apply_all::desc.min_argc_ = 1;
      getp_apply_all::desc.opt_argc_ = 0;
      getp_apply_all::desc.varargs_ = 0;
      __cxa_guard_release(&getp_apply_all(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  vm_rcdesc::vm_rcdesc(&rc,"Vector.applyAll",self,6,sp_ + -1,argc);
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_apply_all::desc);
  pvVar2 = sp_;
  if (iVar3 == 0) {
    funcptr = sp_ + -1;
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_OBJ;
    (pvVar2->val).obj = self;
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
    for (idx = 0; idx < *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
        idx = idx + 1) {
      push_element(this,idx);
      CVmRun::call_func_ptr(&G_interpreter_X,funcptr,1,&rc,0);
      set_element_undo(this,self,idx,&r0_);
    }
    sp_ = sp_ + -2;
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_apply_all(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                 uint *argc)
{
    const vm_val_t *func_val;
    size_t idx;
    static CVmNativeCodeDesc desc(1);
    vm_rcdesc rc(vmg_ "Vector.applyAll", self, 6, G_stk->get(0), argc);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the function pointer argument, but leave it on the stack */
    func_val = G_stk->get(0);

    /* push a self-reference while working to protect from gc */
    G_interpreter->push_obj(vmg_ self);

    /* 
     *   we're going to return the 'self' object, since we update the vector
     *   in-place 
     */
    retval->set_obj(self);

    /*
     *   Go through each element of our vector, invoking the callback on
     *   each element.  Replace each element with the result of the
     *   callback.  Note that we intentionally re-check the element count on
     *   each iteration, in case the callback changes the number of
     *   elements.  
     */
    for (idx = 0 ; idx < get_element_count() ; ++idx)
    {
        /* push this element as the callback's argument */
        push_element(vmg_ idx);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, &rc, 0);

        /* replace this element with the result */
        set_element_undo(vmg_ self, idx, G_interpreter->get_r0());
    }

    /* discard our gc protection (self) and our arguments */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}